

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::parseJsonInto
          (QMakeEvaluator *this,QByteArray *json,QString *into,ProValueMap *value)

{
  char cVar1;
  VisitReturn VVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QJsonDocument document;
  QStringBuilder<const_QString_&,_QLatin1Char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _document = 0xaaaaaaaaaaaaaaaa;
  QJsonDocument::fromJson((QByteArray *)&document,(QJsonParseError *)json);
  cVar1 = QJsonDocument::isNull();
  if (cVar1 != '\0') {
    VVar2 = ReturnFalse;
    goto LAB_001e50a6;
  }
  local_78.size = -0x5555555555555556;
  local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_50.b.ch = '.';
  local_50.a = into;
  QStringBuilder<const_QString_&,_QLatin1Char>::convertTo<QString>((QString *)&local_78,&local_50);
  cVar1 = QJsonDocument::isArray();
  if (cVar1 == '\0') {
    cVar1 = QJsonDocument::isObject();
    VVar2 = ReturnFalse;
    if (cVar1 != '\0') {
      QJsonDocument::object();
      addJsonObject((QJsonObject *)&local_50,(QString *)&local_78,value);
      QJsonObject::~QJsonObject((QJsonObject *)&local_50);
      goto LAB_001e5099;
    }
  }
  else {
    QJsonDocument::array();
    addJsonArray((QJsonArray *)&local_50,(QString *)&local_78,value);
    QJsonArray::~QJsonArray((QJsonArray *)&local_50);
LAB_001e5099:
    VVar2 = ReturnTrue;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_001e50a6:
  QJsonDocument::~QJsonDocument(&document);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar2;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::parseJsonInto(const QByteArray &json, const QString &into, ProValueMap *value)
{
    QJsonParseError error;
    QJsonDocument document = QJsonDocument::fromJson(json, &error);
    if (document.isNull()) {
        if (error.error != QJsonParseError::NoError) {
            ErrorPosition errorPos = calculateErrorPosition(json, error.offset);
            evalError(fL1S("Error parsing JSON at %1:%2: %3")
                      .arg(errorPos.line).arg(errorPos.column).arg(error.errorString()));
        }
        return QMakeEvaluator::ReturnFalse;
    }

    QString currentKey = into + QLatin1Char('.');

    // top-level item is either an array or object
    if (document.isArray())
        addJsonArray(document.array(), currentKey, value);
    else if (document.isObject())
        addJsonObject(document.object(), currentKey, value);
    else
        return QMakeEvaluator::ReturnFalse;

    return QMakeEvaluator::ReturnTrue;
}